

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_source_pkware_encode.c
# Opt level: O0

zip_int64_t
pkware_encrypt(zip_source_t *src,void *ud,void *data,zip_uint64_t length,zip_source_cmd_t cmd)

{
  zip_uint8_t *in;
  _Bool _Var1;
  int iVar2;
  size_t len;
  ulong len_00;
  zip_file_attributes_t *attributes;
  zip_stat_t *st;
  zip_uint64_t buffer_n;
  zip_int64_t n;
  trad_pkware_conflict *ctx;
  zip_uint64_t zStack_30;
  zip_source_cmd_t cmd_local;
  zip_uint64_t length_local;
  void *data_local;
  void *ud_local;
  zip_source_t *src_local;
  
  switch(cmd) {
  case ZIP_SOURCE_OPEN:
    *(undefined1 *)((long)ud + 0x20) = 0;
    _zip_pkware_keys_reset((zip_pkware_keys_t *)((long)ud + 8));
    in = *ud;
    len = strlen(*ud);
    _zip_pkware_encrypt((zip_pkware_keys_t *)((long)ud + 8),(zip_uint8_t *)0x0,in,len);
    iVar2 = encrypt_header(src,(trad_pkware_conflict *)ud);
    if (iVar2 < 0) {
      src_local = (zip_source_t *)0xffffffffffffffff;
    }
    else {
      src_local = (zip_source_t *)0x0;
    }
    break;
  case ZIP_SOURCE_READ:
    st = (zip_stat_t *)0x0;
    zStack_30 = length;
    length_local = (zip_uint64_t)data;
    if (*(long *)((long)ud + 0x18) != 0) {
      st = (zip_stat_t *)
           _zip_buffer_read(*(zip_buffer_t **)((long)ud + 0x18),(zip_uint8_t *)data,length);
      length_local = (long)data + (long)st;
      zStack_30 = length - (long)st;
      _Var1 = _zip_buffer_eof(*(zip_buffer_t **)((long)ud + 0x18));
      if (_Var1) {
        _zip_buffer_free(*(zip_buffer_t **)((long)ud + 0x18));
        *(undefined8 *)((long)ud + 0x18) = 0;
      }
    }
    if ((*(byte *)((long)ud + 0x20) & 1) == 0) {
      len_00 = zip_source_read(src,(void *)length_local,zStack_30);
      if ((long)len_00 < 0) {
        zip_error_set_from_source((zip_error_t *)((long)ud + 0x28),src);
        src_local = (zip_source_t *)0xffffffffffffffff;
      }
      else {
        _zip_pkware_encrypt((zip_pkware_keys_t *)((long)ud + 8),(zip_uint8_t *)length_local,
                            (zip_uint8_t *)length_local,len_00);
        if (len_00 < zStack_30) {
          *(undefined1 *)((long)ud + 0x20) = 1;
        }
        src_local = (zip_source_t *)((long)&st->valid + len_00);
      }
    }
    else {
      src_local = (zip_source_t *)st;
    }
    break;
  case ZIP_SOURCE_CLOSE:
    _zip_buffer_free(*(zip_buffer_t **)((long)ud + 0x18));
    *(undefined8 *)((long)ud + 0x18) = 0;
    src_local = (zip_source_t *)0x0;
    break;
  case ZIP_SOURCE_STAT:
    *(undefined2 *)((long)data + 0x36) = 1;
    *(ulong *)data = *data | 0x80;
    if ((*data & 8) != 0) {
      *(long *)((long)data + 0x20) = *(long *)((long)data + 0x20) + 0xc;
    }
    src_local = (zip_source_t *)0x0;
    break;
  case ZIP_SOURCE_ERROR:
    src_local = (zip_source_t *)zip_error_to_data((zip_error_t *)((long)ud + 0x28),data,length);
    break;
  case ZIP_SOURCE_FREE:
    trad_pkware_free((trad_pkware_conflict *)ud);
    src_local = (zip_source_t *)0x0;
    break;
  default:
    src_local = (zip_source_t *)zip_source_pass_to_lower_layer(src,data,length,cmd);
    break;
  case ZIP_SOURCE_SUPPORTS:
    src_local = (zip_source_t *)
                zip_source_make_command_bitmap(ZIP_SOURCE_OPEN,1,2,3,4,5,0x13,0x15,0xffffffff);
    break;
  case ZIP_SOURCE_GET_FILE_ATTRIBUTES:
    if (length < 0x18) {
      zip_error_set((zip_error_t *)((long)ud + 0x28),0x12,0);
      src_local = (zip_source_t *)0xffffffffffffffff;
    }
    else {
      *(ulong *)data = *data | 0x14;
      *(undefined1 *)((long)data + 0xb) = 0x14;
      *(undefined2 *)((long)data + 0x10) = 8;
      *(undefined2 *)((long)data + 0x12) = 8;
      src_local = (zip_source_t *)0x0;
    }
    break;
  case ZIP_SOURCE_GET_DOS_TIME:
    if (length < 4) {
      zip_error_set((zip_error_t *)((long)ud + 0x28),0x12,0);
      src_local = (zip_source_t *)0xffffffffffffffff;
    }
    else {
      *(undefined4 *)data = *(undefined4 *)((long)ud + 0x22);
      src_local = (zip_source_t *)0x4;
    }
  }
  return (zip_int64_t)src_local;
}

Assistant:

static zip_int64_t
pkware_encrypt(zip_source_t *src, void *ud, void *data, zip_uint64_t length, zip_source_cmd_t cmd) {
    struct trad_pkware *ctx;
    zip_int64_t n;
    zip_uint64_t buffer_n;

    ctx = (struct trad_pkware *)ud;

    switch (cmd) {
    case ZIP_SOURCE_OPEN:
        ctx->eof = false;

        /* initialize keys */
        _zip_pkware_keys_reset(&ctx->keys);
        _zip_pkware_encrypt(&ctx->keys, NULL, (const zip_uint8_t *)ctx->password, strlen(ctx->password));

        if (encrypt_header(src, ctx) < 0) {
            return -1;
        }
        return 0;

    case ZIP_SOURCE_READ:
        buffer_n = 0;

        if (ctx->buffer) {
            /* write header values to data */
            buffer_n = _zip_buffer_read(ctx->buffer, data, length);
            data = (zip_uint8_t *)data + buffer_n;
            length -= buffer_n;

            if (_zip_buffer_eof(ctx->buffer)) {
                _zip_buffer_free(ctx->buffer);
                ctx->buffer = NULL;
            }
        }

        if (ctx->eof) {
            return (zip_int64_t)buffer_n;
        }

        if ((n = zip_source_read(src, data, length)) < 0) {
            zip_error_set_from_source(&ctx->error, src);
            return -1;
        }

        _zip_pkware_encrypt(&ctx->keys, (zip_uint8_t *)data, (zip_uint8_t *)data, (zip_uint64_t)n);

        if ((zip_uint64_t)n < length) {
            ctx->eof = true;
        }

        return (zip_int64_t)buffer_n + n;

    case ZIP_SOURCE_CLOSE:
        _zip_buffer_free(ctx->buffer);
        ctx->buffer = NULL;
        return 0;

    case ZIP_SOURCE_STAT: {
        zip_stat_t *st;

        st = (zip_stat_t *)data;
        st->encryption_method = ZIP_EM_TRAD_PKWARE;
        st->valid |= ZIP_STAT_ENCRYPTION_METHOD;
        if (st->valid & ZIP_STAT_COMP_SIZE) {
            st->comp_size += ZIP_CRYPTO_PKWARE_HEADERLEN;
        }

        return 0;
    }

    case ZIP_SOURCE_GET_FILE_ATTRIBUTES: {
        zip_file_attributes_t *attributes = (zip_file_attributes_t *)data;
        if (length < sizeof(*attributes)) {
            zip_error_set(&ctx->error, ZIP_ER_INVAL, 0);
            return -1;
        }
        attributes->valid |= ZIP_FILE_ATTRIBUTES_VERSION_NEEDED | ZIP_FILE_ATTRIBUTES_GENERAL_PURPOSE_BIT_FLAGS;
        attributes->version_needed = 20;
        attributes->general_purpose_bit_flags = ZIP_GPBF_DATA_DESCRIPTOR;
        attributes->general_purpose_bit_mask = ZIP_GPBF_DATA_DESCRIPTOR;

        return 0;
    }

    case ZIP_SOURCE_GET_DOS_TIME:
        if (length < sizeof(ctx->dostime)) {
            zip_error_set(&ctx->error, ZIP_ER_INVAL, 0);
            return -1;
        }
        (void)memcpy_s(data, sizeof(ctx->dostime), &ctx->dostime, sizeof(ctx->dostime));
        return sizeof(ctx->dostime);

    case ZIP_SOURCE_SUPPORTS:
        return zip_source_make_command_bitmap(ZIP_SOURCE_OPEN, ZIP_SOURCE_READ, ZIP_SOURCE_CLOSE, ZIP_SOURCE_STAT, ZIP_SOURCE_ERROR, ZIP_SOURCE_FREE, ZIP_SOURCE_GET_FILE_ATTRIBUTES, ZIP_SOURCE_GET_DOS_TIME, -1);

    case ZIP_SOURCE_ERROR:
        return zip_error_to_data(&ctx->error, data, length);

    case ZIP_SOURCE_FREE:
        trad_pkware_free(ctx);
        return 0;

    default:
        return zip_source_pass_to_lower_layer(src, data, length, cmd);
    }
}